

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O2

float quad_decode(apriltag_detector_t *td,apriltag_family_t *family,image_u8_t *im,quad *quad,
                 quick_decode_entry *entry,image_u8_t *im_samples)

{
  undefined8 uVar1;
  undefined8 uVar2;
  byte bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  matd_t *H;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  uint64_t uVar11;
  apriltag_detector_t *td_00;
  double *values;
  int i_1;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  int ridx;
  int iVar18;
  ulong uVar19;
  int iVar20;
  uint64_t *puVar21;
  int i;
  int iVar22;
  bool bVar23;
  float fVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar30;
  double extraout_XMM0_Qb;
  undefined1 auVar29 [16];
  float fVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  float fVar34;
  long lStack_2e0;
  graymodel local_2d8;
  graymodel local_258;
  undefined8 local_1d8 [2];
  float local_1c8 [7];
  undefined8 local_1ac;
  undefined8 uStack_1a4;
  float local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined4 local_160;
  float local_15c;
  undefined8 local_158;
  undefined8 uStack_150;
  float local_148;
  undefined8 local_144;
  undefined4 local_13c;
  long local_138;
  apriltag_detector_t *local_130;
  undefined1 local_128 [16];
  undefined1 local_118 [24];
  quick_decode_entry *local_100;
  double local_f8;
  double dStack_f0;
  undefined1 local_e8 [16];
  double local_d8;
  double px;
  double py;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  undefined1 local_98 [16];
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  ulong local_58;
  image_u8_t *local_50;
  double local_48;
  double local_40;
  double *local_38;
  
  local_50 = im_samples;
  local_100 = entry;
  local_1d8[0] = 0x3f000000bf000000;
  local_1d8[1] = 0x3f80000000000000;
  local_1c8[0] = 1.0;
  local_1c8[1] = 0.5;
  local_1c8[2] = 0.5;
  local_1c8[3] = 0.0;
  local_1c8[4] = 1.0;
  local_1c8[5] = 0.0;
  iVar12 = family->width_at_border;
  local_1c8[6] = (float)iVar12 + 0.5;
  local_19c = (float)iVar12 + -0.5;
  local_1ac = 0x3f000000;
  uStack_1a4 = 0x3f8000003f800000;
  local_198 = 0x3f000000;
  uStack_190 = 0x3f800000;
  local_188 = 0xbf0000003f000000;
  uStack_180 = 0x3f800000;
  local_178 = 0x3f0000003f800000;
  uStack_170 = 0x3f8000003f000000;
  local_168 = 0;
  local_160 = 0x3f000000;
  local_15c = local_1c8[6];
  local_158 = 0x3f800000;
  uStack_150 = 0x3f0000003f800000;
  local_148 = local_19c;
  local_144 = 0x3f800000;
  local_13c = 0;
  local_130 = td;
  local_2d8.A[1][0] = 0.0;
  local_2d8.A[1][1] = 0.0;
  local_2d8.A[1][2] = 0.0;
  local_2d8.A[2][0] = 0.0;
  local_2d8.A[2][1] = 0.0;
  local_2d8.A[2][2] = 0.0;
  local_2d8.B[0] = 0.0;
  local_2d8.B[1] = 0.0;
  local_2d8.B[2] = 0.0;
  local_2d8.C[0] = 0.0;
  local_2d8.C[1] = 0.0;
  local_2d8.C[2] = 0.0;
  local_258.A[1][0] = 0.0;
  local_258.A[1][1] = 0.0;
  local_258.A[1][2] = 0.0;
  local_258.A[2][0] = 0.0;
  local_258.A[2][1] = 0.0;
  local_258.A[2][2] = 0.0;
  local_258.B[0] = 0.0;
  local_258.B[1] = 0.0;
  local_258.B[2] = 0.0;
  local_258.C[0] = 0.0;
  local_98 = ZEXT816(0);
  local_258.C[1] = 0.0;
  local_258.C[2] = 0.0;
  local_c0 = 0.0;
  local_b8 = 0.0;
  local_b0 = 0.0;
  local_a8 = 0.0;
  local_a0 = 0.0;
  local_48 = 0.0;
  local_40 = 0.0;
  local_88 = 0.0;
  local_78 = 0.0;
  local_38 = (double *)0x0;
  local_68 = ZEXT816(0);
  local_118._0_16_ = ZEXT816(0);
  local_128 = ZEXT816(0);
  lVar16 = 0;
  while (lVar16 != 8) {
    local_138 = lVar16;
    local_58 = (ulong)(uint)(int)local_1c8[lVar16 * 5];
    py = (double)CONCAT44(py._4_4_,(int)local_1c8[lVar16 * 5] - 1);
    for (iVar22 = 0; iVar22 < iVar12; iVar22 = iVar22 + 1) {
      fVar24 = (float)iVar22;
      fVar31 = (float)iVar12;
      uVar1 = *(undefined8 *)((long)local_1d8 + lVar16 * 0x14);
      uVar2 = *(undefined8 *)((long)local_1d8 + lVar16 * 0x14 + 8);
      auVar27._0_4_ = fVar24 * (float)uVar2 + (float)uVar1;
      auVar27._4_4_ = fVar24 * (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20);
      auVar27._8_4_ = fVar24 * 0.0 + 0.0;
      auVar27._12_4_ = fVar24 * 0.0 + 0.0;
      auVar8._4_4_ = fVar31;
      auVar8._0_4_ = fVar31;
      auVar8._8_4_ = fVar31;
      auVar8._12_4_ = fVar31;
      auVar28 = divps(auVar27,auVar8);
      local_f8 = (double)auVar28._0_4_ + -0.5;
      dStack_f0 = (double)auVar28._4_4_ + -0.5;
      local_f8 = local_f8 + local_f8;
      dStack_f0 = dStack_f0 + dStack_f0;
      local_e8._8_4_ = SUB84(dStack_f0,0);
      local_e8._0_8_ = dStack_f0;
      local_e8._12_4_ = (int)((ulong)dStack_f0 >> 0x20);
      lStack_2e0 = 0x109368;
      homography_project(quad->H,local_f8,dStack_f0,&local_d8,&px);
      uVar13 = (uint)local_d8;
      uVar15 = (uint)px;
      if (((-1 < (int)(uVar13 | uVar15)) && ((int)uVar13 < im->width)) && ((int)uVar15 < im->height)
         ) {
        bVar3 = im->buf[(int)(im->stride * uVar15 + uVar13)];
        if (local_50 != (image_u8_t *)0x0) {
          local_50->buf[(int)(uVar15 * local_50->stride + uVar13)] = SUB81(py,0);
        }
        dVar25 = (double)bVar3;
        if ((int)local_58 == 0) {
          dVar30 = (double)local_118._8_8_ + local_f8 * dStack_f0;
          local_118._8_4_ = SUB84(dVar30,0);
          local_118._0_8_ = (double)local_118._0_8_ + local_f8 * local_f8;
          local_118._12_4_ = (int)((ulong)dVar30 >> 0x20);
          local_a0 = local_a0 + local_f8;
          local_a8 = local_a8 + (double)local_e8._0_8_ * (double)local_e8._0_8_;
          local_b0 = local_b0 + (double)local_e8._0_8_;
          local_b8 = local_b8 + 1.0;
          local_c0 = local_c0 + dVar25;
          dVar30 = (double)local_128._8_8_ + dVar25 * dStack_f0;
          local_128._8_4_ = SUB84(dVar30,0);
          local_128._0_8_ = (double)local_128._0_8_ + dVar25 * local_f8;
          local_128._12_4_ = (int)((ulong)dVar30 >> 0x20);
        }
        else {
          dVar30 = (double)local_98._8_8_ + local_f8 * dStack_f0;
          local_98._8_4_ = SUB84(dVar30,0);
          local_98._0_8_ = (double)local_98._0_8_ + local_f8 * local_f8;
          local_98._12_4_ = (int)((ulong)dVar30 >> 0x20);
          local_38 = (double *)((double)local_38 + local_f8);
          local_78 = local_78 + (double)local_e8._0_8_ * (double)local_e8._0_8_;
          local_88 = local_88 + (double)local_e8._0_8_;
          local_40 = local_40 + 1.0;
          local_48 = local_48 + dVar25;
          dVar30 = (double)local_68._8_8_ + dVar25 * dStack_f0;
          local_68._8_4_ = SUB84(dVar30,0);
          local_68._0_8_ = (double)local_68._0_8_ + dVar25 * local_f8;
          local_68._12_4_ = (int)((ulong)dVar30 >> 0x20);
        }
      }
      iVar12 = family->width_at_border;
    }
    lVar16 = local_138 + 1;
  }
  local_2d8.A[0][0] = (double)local_98._0_8_;
  local_2d8.A[0][1] = (double)local_98._8_8_;
  local_2d8.A[0][2] = (double)local_38;
  local_2d8.A[1][1] = local_78;
  local_2d8.A[1][2] = local_88;
  local_2d8.A[2][2] = local_40;
  local_2d8.B[0] = (double)local_68._0_8_;
  local_2d8.B[1] = (double)local_68._8_8_;
  local_2d8.B[2] = local_48;
  local_258.A[0][0] = (double)local_118._0_8_;
  local_258.A[0][1] = (double)local_118._8_8_;
  local_258.A[0][2] = local_a0;
  local_258.A[1][1] = local_a8;
  local_258.A[1][2] = local_b0;
  local_258.A[2][2] = local_b8;
  local_258.B[0] = (double)local_128._0_8_;
  local_258.B[1] = (double)local_128._8_8_;
  local_258.B[2] = local_c0;
  lStack_2e0 = 0x1095f4;
  graymodel_solve(&local_2d8);
  lStack_2e0 = 0x1095fc;
  graymodel_solve(&local_258);
  dVar25 = local_258.C[0] * 0.0 + local_258.C[1] * 0.0;
  dVar30 = local_258.C[2] + dVar25;
  uVar32 = SUB84(dVar30,0);
  if (family->reversed_border !=
      local_2d8.C[2] + local_2d8.C[0] * 0.0 + local_2d8.C[1] * 0.0 < dVar30) {
    return -1.0;
  }
  lVar16 = -((ulong)(uint)(family->total_width * family->total_width) * 8 + 0xf & 0x7fffffff0);
  iVar12 = family->total_width;
  local_88 = local_258.C[0];
  dStack_80 = 0.0;
  local_78 = local_258.C[1];
  dStack_70 = 0.0;
  local_68._8_8_ = 0;
  local_68._0_8_ = local_258.C[2];
  local_f8 = local_2d8.C[1];
  dStack_f0 = 0.0;
  local_e8._8_8_ = 0;
  local_e8._0_8_ = local_2d8.C[0];
  local_98._8_8_ = 0;
  local_98._0_8_ = local_2d8.C[2];
  py = (double)&local_2d8;
  local_38 = (double *)((long)&local_2d8 + lVar16);
  *(undefined8 *)((long)&lStack_2e0 + lVar16) = 0x1096cf;
  memset((double *)((long)&local_2d8 + lVar16),0,(ulong)(uint)(iVar12 * iVar12) << 3);
  dVar30 = (double)CONCAT44((int)((ulong)dVar30 >> 0x20),uVar32);
  iVar22 = family->width_at_border;
  *(undefined8 *)((long)&lStack_2e0 + lVar16) = 2;
  dVar26 = 0.0;
  local_58 = CONCAT44(local_58._4_4_,
                      (iVar22 - iVar12) / (int)*(undefined8 *)((long)&lStack_2e0 + lVar16));
  dStack_80 = local_e8._0_8_;
  dStack_70 = local_f8;
  local_68._8_8_ = local_98._0_8_;
  while( true ) {
    values = local_38;
    td_00 = local_130;
    uVar13 = family->nbits;
    if ((ulong)uVar13 <= (ulong)dVar26) break;
    uVar4 = family->bit_y[(long)dVar26];
    uVar5 = family->bit_x[(long)dVar26];
    dVar10 = ((double)(int)uVar5 + 0.5) / (double)family->width_at_border + -0.5;
    dVar10 = dVar10 + dVar10;
    dVar9 = ((double)(int)uVar4 + 0.5) / (double)family->width_at_border + -0.5;
    dVar9 = dVar9 + dVar9;
    H = quad->H;
    local_e8._8_4_ = SUB84(dVar25,0);
    local_e8._0_8_ = dVar10;
    local_e8._12_4_ = (int)((ulong)dVar25 >> 0x20);
    local_98._8_4_ = SUB84(dVar30,0);
    local_98._0_8_ = dVar9;
    local_98._12_4_ = (int)((ulong)dVar30 >> 0x20);
    local_f8 = dVar26;
    *(undefined8 *)((long)&lStack_2e0 + lVar16) = 0x1097a4;
    homography_project(H,dVar10,dVar9,&local_d8,&px);
    dVar26 = px;
    dVar30 = local_d8;
    uVar32 = 0;
    uVar33 = 0;
    local_48 = local_d8;
    local_40 = px;
    *(undefined8 *)((long)&lStack_2e0 + lVar16) = 0x1097c6;
    dVar26 = value_for_pixel(im,dVar30,dVar26);
    dVar30 = (double)CONCAT44(uVar33,uVar32);
    if ((dVar26 != -1.0) || (NAN(dVar26))) {
      dVar30 = (double)local_e8._0_8_ * dStack_80 + (double)local_98._0_8_ * dStack_70 +
               (double)local_68._8_8_;
      dVar9 = (dVar30 + (double)local_e8._0_8_ * local_88 + (double)local_98._0_8_ * local_78 +
                        (double)local_68._0_8_) * 0.5;
      local_38[(int)((uVar5 - (int)local_58) + (uVar4 - (int)local_58) * family->total_width)] =
           dVar26 - dVar9;
      dVar25 = extraout_XMM0_Qb;
      if (local_50 != (image_u8_t *)0x0) {
        local_50->buf[(int)local_40 * local_50->stride + (int)local_48] = -(dVar26 < dVar9);
      }
    }
    dVar26 = (double)((long)local_f8 + 1);
  }
  iVar12 = family->total_width;
  *(undefined8 *)((long)&lStack_2e0 + lVar16) = 0x1098b9;
  sharpen(td_00,values,iVar12);
  auVar28 = ZEXT816(0);
  fVar34 = 1.0;
  fVar31 = 1.0;
  fVar24 = 0.0;
  uVar19 = 0;
  for (dVar25 = 0.0; (double)(ulong)uVar13 != dVar25; dVar25 = (double)((long)dVar25 + 1)) {
    uVar19 = uVar19 * 2;
    dVar30 = values[(int)((family->bit_x[(long)dVar25] - (int)local_58) +
                         (family->bit_y[(long)dVar25] - (int)local_58) * iVar12)];
    if (dVar30 <= 0.0) {
      fVar24 = (float)((double)fVar24 - dVar30);
      fVar31 = fVar31 + 1.0;
    }
    else {
      auVar29._8_8_ = auVar28._8_8_;
      auVar29._0_8_ = (double)auVar28._0_4_;
      auVar28._4_12_ = auVar29._4_12_;
      auVar28._0_4_ = (float)(dVar30 + auVar29._0_8_);
      fVar34 = fVar34 + 1.0;
      uVar19 = uVar19 | 1;
    }
  }
  iVar12 = *family->impl;
  lVar6 = *(long *)((long)family->impl + 8);
  bVar23 = (uVar13 & 0x80000003) == 1;
  iVar22 = uVar13 - bVar23;
  *(undefined8 *)((long)&lStack_2e0 + lVar16) = 4;
  iVar20 = (int)*(undefined8 *)((long)&lStack_2e0 + lVar16);
  *(undefined8 *)((long)&lStack_2e0 + lVar16) = 0xffffffffffffffff;
  iVar18 = 0;
  do {
    if (iVar18 == 4) {
      local_100->rcode = 0;
      local_100->id = 0xffff;
      local_100->hamming = 0xff;
      iVar18 = 0;
LAB_001099eb:
      local_100->rotation = (uint8_t)iVar18;
      fVar24 = fminf(auVar28._0_4_ / fVar34,fVar24 / fVar31);
      return fVar24;
    }
    uVar17 = uVar19 % (ulong)(long)iVar12;
    while( true ) {
      lVar14 = (long)(int)uVar17 * 0x10;
      uVar7 = *(ulong *)(lVar6 + lVar14);
      if (uVar7 == 0xffffffffffffffff) break;
      if (uVar7 == uVar19) {
        puVar21 = (uint64_t *)(lVar6 + lVar14);
        uVar11 = puVar21[1];
        local_100->rcode = *puVar21;
        local_100->id = (short)uVar11;
        local_100->hamming = (char)(uVar11 >> 0x10);
        local_100->rotation = (char)(uVar11 >> 0x18);
        *(int *)&local_100->field_0xc = (int)(uVar11 >> 0x20);
        goto LAB_001099eb;
      }
      uVar17 = (long)((int)uVar17 + 1) % (long)iVar12 & 0xffffffff;
    }
    uVar19 = ((ulong)((uint)uVar19 & (uint)bVar23) |
              (uVar19 >> bVar23) << ((char)(iVar22 / iVar20) + bVar23 & 0x3fU) |
             (uVar19 >> ((char)((iVar22 * 3) / iVar20) + bVar23 & 0x3fU)) << bVar23) &
             ~(*(long *)((long)&lStack_2e0 + lVar16) << ((byte)uVar13 & 0x3f));
    iVar18 = iVar18 + 1;
  } while( true );
}

Assistant:

float quad_decode(apriltag_detector_t* td, apriltag_family_t *family, image_u8_t *im, struct quad *quad, struct quick_decode_entry *entry, image_u8_t *im_samples)
{
    // decode the tag binary contents by sampling the pixel
    // closest to the center of each bit cell.

    // We will compute a threshold by sampling known white/black cells around this tag.
    // This sampling is achieved by considering a set of samples along lines.
    //
    // coordinates are given in bit coordinates. ([0, fam->border_width]).
    //
    // { initial x, initial y, delta x, delta y, WHITE=1 }
    float patterns[] = {
        // left white column
        -0.5, 0.5,
        0, 1,
        1,

        // left black column
        0.5, 0.5,
        0, 1,
        0,

        // right white column
        family->width_at_border + 0.5, .5,
        0, 1,
        1,

        // right black column
        family->width_at_border - 0.5, .5,
        0, 1,
        0,

        // top white row
        0.5, -0.5,
        1, 0,
        1,

        // top black row
        0.5, 0.5,
        1, 0,
        0,

        // bottom white row
        0.5, family->width_at_border + 0.5,
        1, 0,
        1,

        // bottom black row
        0.5, family->width_at_border - 0.5,
        1, 0,
        0

        // XXX double-counts the corners.
    };

    struct graymodel whitemodel, blackmodel;
    graymodel_init(&whitemodel);
    graymodel_init(&blackmodel);

    for (int pattern_idx = 0; pattern_idx < sizeof(patterns)/(5*sizeof(float)); pattern_idx ++) {
        float *pattern = &patterns[pattern_idx * 5];

        int is_white = pattern[4];

        for (int i = 0; i < family->width_at_border; i++) {
            double tagx01 = (pattern[0] + i*pattern[2]) / (family->width_at_border);
            double tagy01 = (pattern[1] + i*pattern[3]) / (family->width_at_border);

            double tagx = 2*(tagx01-0.5);
            double tagy = 2*(tagy01-0.5);

            double px, py;
            homography_project(quad->H, tagx, tagy, &px, &py);

            // don't round
            int ix = px;
            int iy = py;
            if (ix < 0 || iy < 0 || ix >= im->width || iy >= im->height)
                continue;

            int v = im->buf[iy*im->stride + ix];

            if (im_samples) {
                im_samples->buf[iy*im_samples->stride + ix] = (1-is_white)*255;
            }

            if (is_white)
                graymodel_add(&whitemodel, tagx, tagy, v);
            else
                graymodel_add(&blackmodel, tagx, tagy, v);
        }
    }

    graymodel_solve(&whitemodel);
    graymodel_solve(&blackmodel);

    // XXX Tunable
    if ((graymodel_interpolate(&whitemodel, 0, 0) - graymodel_interpolate(&blackmodel, 0, 0) < 0) != family->reversed_border) {
        return -1;
    }

    // compute the average decision margin (how far was each bit from
    // the decision boundary?
    //
    // we score this separately for white and black pixels and return
    // the minimum average threshold for black/white pixels. This is
    // to penalize thresholds that are too close to an extreme.
    float black_score = 0, white_score = 0;
    float black_score_count = 1, white_score_count = 1;

    double values[family->total_width*family->total_width];
    memset(values, 0, family->total_width*family->total_width*sizeof(double));

    int min_coord = (family->width_at_border - family->total_width)/2;
    for (int i = 0; i < family->nbits; i++) {
        int bity = family->bit_y[i];
        int bitx = family->bit_x[i];

        double tagx01 = (bitx + 0.5) / (family->width_at_border);
        double tagy01 = (bity + 0.5) / (family->width_at_border);

        // scale to [-1, 1]
        double tagx = 2*(tagx01-0.5);
        double tagy = 2*(tagy01-0.5);

        double px, py;
        homography_project(quad->H, tagx, tagy, &px, &py);

        double v = value_for_pixel(im, px, py);

        if (v == -1) {
            continue;
        }

        double thresh = (graymodel_interpolate(&blackmodel, tagx, tagy) + graymodel_interpolate(&whitemodel, tagx, tagy)) / 2.0;
        values[family->total_width*(bity - min_coord) + bitx - min_coord] = v - thresh;

        if (im_samples) {
            int ix = px;
            int iy = py;
            im_samples->buf[iy*im_samples->stride + ix] = (v < thresh) * 255;
        }
    }

    sharpen(td, values, family->total_width);

    uint64_t rcode = 0;
    for (int i = 0; i < family->nbits; i++) {
        int bity = family->bit_y[i];
        int bitx = family->bit_x[i];
        rcode = (rcode << 1);
        double v = values[(bity - min_coord)*family->total_width + bitx - min_coord];

        if (v > 0) {
            white_score += v;
            white_score_count++;
            rcode |= 1;
        } else {
            black_score -= v;
            black_score_count++;
        }
    }

    quick_decode_codeword(family, rcode, entry);
    return fmin(white_score / white_score_count, black_score / black_score_count);
}